

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::Descriptor>
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  string_view text;
  string nested_name;
  string parent_name;
  string local_58;
  string local_38;
  
  if (containing_descriptor != (Descriptor *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_58,this,descriptor);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_38,this,containing_descriptor);
    text._M_str = "$nested_name$.containing_type = $parent_name$\n";
    text._M_len = 0x2e;
    io::Printer::Print<char[12],std::__cxx11::string,char[12],std::__cxx11::string>
              (this->printer_,text,(char (*) [12])"nested_name",&local_58,
               (char (*) [12])"parent_name",&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != nullptr) {
    const std::string nested_name = ModuleLevelDescriptorName(descriptor);
    const std::string parent_name =
        ModuleLevelDescriptorName(*containing_descriptor);
    printer_->Print("$nested_name$.containing_type = $parent_name$\n",
                    "nested_name", nested_name, "parent_name", parent_name);
  }
}